

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_Proto3ExtensionError_Test::
ParserValidationErrorTest_Proto3ExtensionError_Test
          (ParserValidationErrorTest_Proto3ExtensionError_Test *this)

{
  ParserValidationErrorTest_Proto3ExtensionError_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParserValidationErrorTest);
  (this->super_ParserValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParserValidationErrorTest_Proto3ExtensionError_Test_02a0f130;
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto3ExtensionError) {
  ExpectHasValidationErrors(
      "syntax = 'proto3';\n"
      "message Foo { \n"
      "  extensions 100 to 199;\n"
      "}\n"
      "extend Foo { string foo = 101; }\n",
      "4:7: Extensions in proto3 are only allowed for defining options.\n"
      "2:13: Extension ranges are not allowed in proto3.\n");
}